

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExclusivePublication.cpp
# Opt level: O0

void __thiscall
aeron::ExclusivePublication::addDestination(ExclusivePublication *this,string *endpointChannel)

{
  bool bVar1;
  IllegalStateException *this_00;
  char *pcVar2;
  string *in_stack_ffffffffffffff40;
  int64_t in_stack_ffffffffffffff48;
  allocator *filename;
  ClientConductor *in_stack_ffffffffffffff50;
  allocator local_91;
  string local_90;
  allocator local_69;
  string local_68;
  allocator local_31;
  string local_30;
  
  bVar1 = isClosed((ExclusivePublication *)0x2144e9);
  if (!bVar1) {
    ClientConductor::addDestination
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    return;
  }
  this_00 = (IllegalStateException *)__cxa_allocate_exception(0x48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"Publication is closed",&local_31);
  filename = &local_69;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_68,
             "void aeron::ExclusivePublication::addDestination(const std::string &)",filename);
  pcVar2 = util::past_prefix((char *)this_00,(char *)filename);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_90,pcVar2,&local_91);
  util::IllegalStateException::IllegalStateException(this_00,&local_30,&local_68,&local_90,0x4f);
  __cxa_throw(this_00,&util::IllegalStateException::typeinfo,
              util::IllegalStateException::~IllegalStateException);
}

Assistant:

void ExclusivePublication::addDestination(const std::string& endpointChannel)
{
    if (isClosed())
    {
        throw util::IllegalStateException(std::string("Publication is closed"), SOURCEINFO);
    }

    m_conductor.addDestination(m_originalRegistrationId, endpointChannel);
}